

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_observer_prologue(Executor *this,Worker *worker,Node *node)

{
  bool bVar1;
  element_type *this_00;
  Node *in_RDX;
  Worker *in_RSI;
  long in_RDI;
  shared_ptr<tf::ObserverInterface> *observer;
  iterator __end1;
  iterator __begin1;
  unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
  *__range1;
  unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
  *in_stack_ffffffffffffffa8;
  TaskView local_48;
  WorkerView local_40;
  reference local_38;
  _Node_iterator_base<std::shared_ptr<tf::ObserverInterface>,_false> local_30;
  _Node_iterator_base<std::shared_ptr<tf::ObserverInterface>,_false> local_28;
  long local_20;
  Node *local_18;
  Worker *local_10;
  
  local_20 = in_RDI + 0x100;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_38 = std::__detail::_Node_iterator<std::shared_ptr<tf::ObserverInterface>,_true,_false>::
               operator*((_Node_iterator<std::shared_ptr<tf::ObserverInterface>,_true,_false> *)
                         0x120f00);
    this_00 = std::
              __shared_ptr_access<tf::ObserverInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<tf::ObserverInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x120f0f);
    WorkerView::WorkerView(&local_40,local_10);
    TaskView::TaskView(&local_48,local_18);
    (*this_00->_vptr_ObserverInterface[3])(this_00,local_40._worker,local_48._node);
    std::__detail::_Node_iterator<std::shared_ptr<tf::ObserverInterface>,_true,_false>::operator++
              ((_Node_iterator<std::shared_ptr<tf::ObserverInterface>,_true,_false> *)this_00);
  }
  return;
}

Assistant:

inline void Executor::_observer_prologue(Worker& worker, Node* node) {
  for(auto& observer : _observers) {
    observer->on_entry(WorkerView(worker), TaskView(*node));
  }
}